

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataGroup.cpp
# Opt level: O3

bool __thiscall DL::DataGroup::isAllNamedNumber(DataGroup *this)

{
  element_type *peVar1;
  pointer pDVar2;
  pointer pDVar3;
  pointer pDVar4;
  bool bVar5;
  
  peVar1 = (this->mShared).super___shared_ptr<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    __assert_fail("(mShared)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/PearCoding[P]DataLisp/src/DataGroup.cpp"
                  ,0xd3,"bool DL::DataGroup::isAllNamedNumber() const");
  }
  pDVar2 = (peVar1->NamedData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar3 = *(pointer *)
            ((long)&(peVar1->NamedData).super__Vector_base<DL::Data,_std::allocator<DL::Data>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if (pDVar2 == pDVar3) {
    bVar5 = false;
  }
  else {
    do {
      pDVar4 = pDVar2 + 1;
      bVar5 = pDVar2->mType - DT_Integer < 2;
      if (!bVar5) {
        return bVar5;
      }
      pDVar2 = pDVar4;
    } while (pDVar4 != pDVar3);
  }
  return bVar5;
}

Assistant:

bool DataGroup::isAllNamedNumber() const
{
	DL_ASSERT(mShared);

	if (mShared->NamedData.empty())
		return false;

	for (const Data& d : mShared->NamedData) {
		if (!d.isNumber())
			return false;
	}

	return true;
}